

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_trap(m68k_info *info,int size,int immediate)

{
  byte bVar1;
  
  MCInst_setOpcode(info->inst,*(uint *)((long)s_trap_lut + (ulong)(info->ir >> 6 & 0x3c)));
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = size;
  (info->extension).operands[0].type = M68K_OP_IMM;
  (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
  (info->extension).operands[0].field_0 = (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)immediate;
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  return;
}

Assistant:

static void build_trap(m68k_info *info, int size, int immediate)
{
	build_absolute_jump_with_immediate(info, s_trap_lut[(info->ir >> 8) & 0xf], size, immediate);
}